

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZROTnode.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChLoadXYZROTnodeXYZROTnodeBushingSpherical::ChLoadXYZROTnodeXYZROTnodeBushingSpherical
          (ChLoadXYZROTnodeXYZROTnodeBushingSpherical *this,
          shared_ptr<chrono::fea::ChNodeFEAxyzrot> *mnodeA,
          shared_ptr<chrono::fea::ChNodeFEAxyzrot> *mnodeB,ChFrame<double> *abs_application,
          ChVector<double> *mstiffness,ChVector<double> *mdamping)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> local_38;
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> local_28;
  
  local_28.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mnodeA->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  local_28.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (mnodeA->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  p_Var1 = (mnodeA->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  local_38.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mnodeB->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  local_38.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (mnodeB->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  p_Var1 = (mnodeB->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  ChLoadXYZROTnodeXYZROTnode::ChLoadXYZROTnodeXYZROTnode
            (&this->super_ChLoadXYZROTnodeXYZROTnode,&local_28,&local_38,abs_application);
  if (local_38.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_28.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  (this->super_ChLoadXYZROTnodeXYZROTnode).super_ChLoadCustomMultiple.super_ChLoadBase.super_ChObj.
  _vptr_ChObj = (_func_int **)&PTR__ChLoadXYZROTnodeXYZROTnode_00b2b120;
  (this->stiffness).m_data[0] = mstiffness->m_data[0];
  (this->stiffness).m_data[1] = mstiffness->m_data[1];
  (this->stiffness).m_data[2] = mstiffness->m_data[2];
  (this->damping).m_data[0] = mdamping->m_data[0];
  (this->damping).m_data[1] = mdamping->m_data[1];
  (this->damping).m_data[2] = mdamping->m_data[2];
  return;
}

Assistant:

ChLoadXYZROTnodeXYZROTnodeBushingSpherical::ChLoadXYZROTnodeXYZROTnodeBushingSpherical(
    std::shared_ptr<ChNodeFEAxyzrot> mnodeA,  ///< node A
    std::shared_ptr<ChNodeFEAxyzrot> mnodeB,  ///< node B
    const ChFrame<>& abs_application,  ///< bushing location, in abs. coordinates. Will define loc_application_A and
                                       ///< loc_application_B
    const ChVector<>& mstiffness,      ///< stiffness, along x y z axes of the abs_application
    const ChVector<>& mdamping         ///< damping, along x y z axes of the abs_application
    )
    : ChLoadXYZROTnodeXYZROTnode(mnodeA, mnodeB, abs_application), stiffness(mstiffness), damping(mdamping) {}